

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functions.c
# Opt level: O3

double Jupiter_strtod_nospace_s(char *str,size_t length)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  size_t length_00;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  if (length == 0) {
    dVar6 = 0.0;
  }
  else {
    bVar2 = *str;
    if (bVar2 == 0x2b) {
      length = length - 1;
      bVar2 = str[1];
      str = str + 1;
    }
    else if (bVar2 == 0x2d) {
      dVar6 = Jupiter_strtod_nospace_s(str + 1,length - 1);
      return -dVar6;
    }
    dVar6 = 0.0;
    while (0xfffffffffffffff5 < (ulong)bVar2 - 0x3a) {
      dVar6 = dVar6 * 10.0 +
              (double)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                      [bVar2];
      if (length == 1) {
        return dVar6;
      }
      pbVar1 = (byte *)(str + 1);
      str = str + 1;
      length = length - 1;
      bVar2 = *pbVar1;
    }
    if (bVar2 == 0x2e) {
      bVar2 = str[1];
      lVar4 = length - 1;
      if (lVar4 == 0) {
        length_00 = 0xffffffffffffffff;
      }
      else {
        uVar5 = (ulong)bVar2;
        if (0xfffffffffffffff5 < uVar5 - 0x3a) {
          iVar3 = 10;
          do {
            dVar6 = (double)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                            [uVar5] / (double)iVar3 + dVar6;
            if (lVar4 == 1) {
              return dVar6;
            }
            iVar3 = iVar3 * 10;
            bVar2 = str[2];
            uVar5 = (ulong)bVar2;
            str = str + 1;
            lVar4 = lVar4 + -1;
          } while (0xfffffffffffffff5 < uVar5 - 0x3a);
        }
        length_00 = lVar4 - 1;
      }
      if ((bVar2 | 0x20) == 0x65) {
        iVar3 = Jupiter_strtoi_nospace_s(str + 2,length_00,10);
        dVar7 = pow(10.0,(double)iVar3);
        dVar6 = dVar6 * dVar7;
      }
    }
  }
  return dVar6;
}

Assistant:

double Jupiter_strtod_nospace_s(const char *str, size_t length)
{
	const int base = 10;
	double total = 0.0;
	double decimal = 0.0;
	int tval;

	if (length == 0)
		return 0;

	if (*str == '-')
		return -1 * Jupiter_strtod_nospace_s(++str, --length);

	if (*str == '+')
		++str, --length;

	while ((tval = Jupiter_getBase(*str, base)) != -1)
	{
		total = base * total + tval;
		if (--length == 0)
			return total;
		++str;
	}

	if (*str == '.')
	{
		++str;
		--length;

		tval = base;
		while (length != 0 && (decimal = Jupiter_getBase(*str, base)) != -1)
		{
			total = total + (decimal / tval);
			if (--length == 0)
				return total;
			++str;
			tval = tval * base;
		}
		if (*str == 'e' || *str == 'E')
			total = total * pow(base, Jupiter_strtoi_nospace_s(++str, --length, 10));
	}

	return total;
}